

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftp.c
# Opt level: O3

CURLcode ftp_parse_url_path(Curl_easy *data)

{
  uchar uVar1;
  connectdata *pcVar2;
  FILEPROTO *pFVar3;
  size_t sVar4;
  CURLcode CVar5;
  int iVar6;
  char **ppcVar7;
  char *__dest;
  char *pcVar8;
  size_t sVar9;
  size_t sVar10;
  char *pcVar11;
  char *rawPath;
  size_t pathLen;
  char *local_48;
  size_t local_40;
  FILEPROTO *local_38;
  
  pcVar2 = data->conn;
  pFVar3 = (data->req).p.file;
  local_48 = (char *)0x0;
  local_40 = 0;
  (pcVar2->proto).ftpc.ctl_valid = false;
  (pcVar2->proto).ftpc.cwdfail = false;
  CVar5 = Curl_urldecode(pFVar3->path,0,&local_48,&local_40,REJECT_CTRL);
  pcVar8 = local_48;
  if (CVar5 != CURLE_OK) {
    Curl_failf(data,"path contains control characters");
    return CVar5;
  }
  uVar1 = (data->set).ftp_filemethod;
  local_38 = pFVar3;
  if (uVar1 == '\x03') {
    pcVar11 = strrchr(local_48,0x2f);
    if (pcVar11 == (char *)0x0) goto LAB_005fb55b;
    sVar9 = (long)pcVar11 - (long)pcVar8;
    if (sVar9 == 0) {
      sVar9 = 1;
    }
    ppcVar7 = (char **)(*Curl_ccalloc)(1,8);
    (pcVar2->proto).ftpc.dirs = ppcVar7;
    if (ppcVar7 == (char **)0x0) {
LAB_005fb5de:
      (*Curl_cfree)(local_48);
      return CURLE_OUT_OF_MEMORY;
    }
    pcVar8 = (char *)(*Curl_ccalloc)(1,sVar9 + 1);
    *(pcVar2->proto).ftpc.dirs = pcVar8;
    pcVar8 = *(pcVar2->proto).ftpc.dirs;
    if (pcVar8 == (char *)0x0) goto LAB_005fb5de;
    strncpy(pcVar8,local_48,sVar9);
    (pcVar2->proto).ftpc.dirdepth = 1;
    pcVar8 = pcVar11 + 1;
  }
  else {
    if (uVar1 != '\x02') {
      iVar6 = 0;
      pcVar11 = local_48;
      do {
        if (*pcVar11 == '/') {
          iVar6 = iVar6 + 1;
        }
        else if (*pcVar11 == '\0') goto LAB_005fb497;
        pcVar11 = pcVar11 + 1;
      } while( true );
    }
    if ((local_40 == 0) || (local_48[local_40 - 1] == '/')) goto LAB_005fb58c;
  }
LAB_005fb563:
  if (*pcVar8 == '\0') goto LAB_005fb58c;
  pcVar8 = (*Curl_cstrdup)(pcVar8);
  (pcVar2->proto).ftpc.file = pcVar8;
  if ((((data->set).field_0x8e5 & 4) != 0) && (pcVar8 == (char *)0x0)) goto LAB_005fb5a0;
LAB_005fb5ad:
  sVar4 = local_40;
  (pcVar2->proto).ftpc.cwddone = false;
  uVar1 = (data->set).ftp_filemethod;
  if ((uVar1 != '\x02') || (*local_48 != '/')) {
    if (((pcVar2->bits).field_0x4 & 0x80) == 0) {
      pcVar11 = "";
    }
    else {
      pcVar11 = (pcVar2->proto).ftpc.prevpath;
      if (pcVar11 == (char *)0x0) goto LAB_005fb685;
    }
    if (uVar1 == '\x02') {
      sVar9 = 0;
    }
    else {
      if (pcVar8 == (char *)0x0) {
        sVar9 = 0;
      }
      else {
        sVar9 = strlen(pcVar8);
      }
      sVar9 = sVar4 - sVar9;
    }
    sVar10 = strlen(pcVar11);
    if ((sVar10 != sVar9) || (iVar6 = strncmp(local_48,pcVar11,sVar9), iVar6 != 0))
    goto LAB_005fb685;
    Curl_infof(data,"Request has same path as previous transfer");
  }
  (pcVar2->proto).ftpc.cwddone = true;
LAB_005fb685:
  (*Curl_cfree)(local_48);
  return CURLE_OK;
LAB_005fb497:
  if (0 < iVar6) {
    ppcVar7 = (char **)(*Curl_ccalloc)((size_t)iVar6,8);
    (pcVar2->proto).ftpc.dirs = ppcVar7;
    if (ppcVar7 == (char **)0x0) goto LAB_005fb5de;
    pcVar11 = strchr(pcVar8,0x2f);
    if (pcVar11 != (char *)0x0) {
      do {
        sVar9 = (long)pcVar11 - (long)pcVar8;
        if (sVar9 == 0) {
          if ((pcVar2->proto).ftpc.dirdepth == 0) {
            sVar9 = 1;
            goto LAB_005fb4e3;
          }
        }
        else {
LAB_005fb4e3:
          __dest = (char *)(*Curl_ccalloc)(1,sVar9 + 1);
          if (__dest == (char *)0x0) goto LAB_005fb5de;
          strncpy(__dest,pcVar8,sVar9);
          iVar6 = (pcVar2->proto).ftpc.dirdepth;
          (pcVar2->proto).ftpc.dirdepth = iVar6 + 1;
          (pcVar2->proto).ftpc.dirs[iVar6] = __dest;
        }
        pcVar8 = pcVar11 + 1;
        pcVar11 = strchr(pcVar8,0x2f);
      } while (pcVar11 != (char *)0x0);
      goto LAB_005fb563;
    }
  }
LAB_005fb55b:
  if (pcVar8 != (char *)0x0) goto LAB_005fb563;
LAB_005fb58c:
  (pcVar2->proto).ftpc.file = (char *)0x0;
  if (((data->set).field_0x8e5 & 4) != 0) {
LAB_005fb5a0:
    if (local_38->fd == 0) {
      Curl_failf(data,"Uploading to a URL without a file name");
      (*Curl_cfree)(local_48);
      return CURLE_URL_MALFORMAT;
    }
  }
  pcVar8 = (char *)0x0;
  goto LAB_005fb5ad;
}

Assistant:

static
CURLcode ftp_parse_url_path(struct Curl_easy *data)
{
  /* the ftp struct is already inited in ftp_connect() */
  struct FTP *ftp = data->req.p.ftp;
  struct connectdata *conn = data->conn;
  struct ftp_conn *ftpc = &conn->proto.ftpc;
  const char *slashPos = NULL;
  const char *fileName = NULL;
  CURLcode result = CURLE_OK;
  char *rawPath = NULL; /* url-decoded "raw" path */
  size_t pathLen = 0;

  ftpc->ctl_valid = FALSE;
  ftpc->cwdfail = FALSE;

  /* url-decode ftp path before further evaluation */
  result = Curl_urldecode(ftp->path, 0, &rawPath, &pathLen, REJECT_CTRL);
  if(result) {
    failf(data, "path contains control characters");
    return result;
  }

  switch(data->set.ftp_filemethod) {
    case FTPFILE_NOCWD: /* fastest, but less standard-compliant */

      if((pathLen > 0) && (rawPath[pathLen - 1] != '/'))
          fileName = rawPath;  /* this is a full file path */
      /*
        else: ftpc->file is not used anywhere other than for operations on
              a file. In other words, never for directory operations.
              So we can safely leave filename as NULL here and use it as a
              argument in dir/file decisions.
      */
      break;

    case FTPFILE_SINGLECWD:
      slashPos = strrchr(rawPath, '/');
      if(slashPos) {
        /* get path before last slash, except for / */
        size_t dirlen = slashPos - rawPath;
        if(dirlen == 0)
            dirlen++;

        ftpc->dirs = calloc(1, sizeof(ftpc->dirs[0]));
        if(!ftpc->dirs) {
          free(rawPath);
          return CURLE_OUT_OF_MEMORY;
        }

        ftpc->dirs[0] = calloc(1, dirlen + 1);
        if(!ftpc->dirs[0]) {
          free(rawPath);
          return CURLE_OUT_OF_MEMORY;
        }

        strncpy(ftpc->dirs[0], rawPath, dirlen);
        ftpc->dirdepth = 1; /* we consider it to be a single dir */
        fileName = slashPos + 1; /* rest is file name */
      }
      else
        fileName = rawPath; /* file name only (or empty) */
      break;

    default: /* allow pretty much anything */
    case FTPFILE_MULTICWD: {
      /* current position: begin of next path component */
      const char *curPos = rawPath;

      int dirAlloc = 0; /* number of entries allocated for the 'dirs' array */
      const char *str = rawPath;
      for(; *str != 0; ++str)
        if (*str == '/')
          ++dirAlloc;

      if(dirAlloc > 0) {
        ftpc->dirs = calloc(dirAlloc, sizeof(ftpc->dirs[0]));
        if(!ftpc->dirs) {
          free(rawPath);
          return CURLE_OUT_OF_MEMORY;
        }

        /* parse the URL path into separate path components */
        while((slashPos = strchr(curPos, '/'))) {
          size_t compLen = slashPos - curPos;

          /* path starts with a slash: add that as a directory */
          if((compLen == 0) && (ftpc->dirdepth == 0))
            ++compLen;

          /* we skip empty path components, like "x//y" since the FTP command
             CWD requires a parameter and a non-existent parameter a) doesn't
             work on many servers and b) has no effect on the others. */
          if(compLen > 0) {
            char *comp = calloc(1, compLen + 1);
            if(!comp) {
              free(rawPath);
              return CURLE_OUT_OF_MEMORY;
            }
            strncpy(comp, curPos, compLen);
            ftpc->dirs[ftpc->dirdepth++] = comp;
          }
          curPos = slashPos + 1;
        }
      }
      DEBUGASSERT(ftpc->dirdepth <= dirAlloc);
      fileName = curPos; /* the rest is the file name (or empty) */
    }
    break;
  } /* switch */

  if(fileName && *fileName)
    ftpc->file = strdup(fileName);
  else
    ftpc->file = NULL; /* instead of point to a zero byte,
                            we make it a NULL pointer */

  if(data->set.upload && !ftpc->file && (ftp->transfer == PPTRANSFER_BODY)) {
    /* We need a file name when uploading. Return error! */
    failf(data, "Uploading to a URL without a file name");
    free(rawPath);
    return CURLE_URL_MALFORMAT;
  }

  ftpc->cwddone = FALSE; /* default to not done */

  if((data->set.ftp_filemethod == FTPFILE_NOCWD) && (rawPath[0] == '/'))
    ftpc->cwddone = TRUE; /* skip CWD for absolute paths */
  else { /* newly created FTP connections are already in entry path */
    const char *oldPath = conn->bits.reuse ? ftpc->prevpath : "";
    if(oldPath) {
      size_t n = pathLen;
      if(data->set.ftp_filemethod == FTPFILE_NOCWD)
        n = 0; /* CWD to entry for relative paths */
      else
        n -= ftpc->file?strlen(ftpc->file):0;

      if((strlen(oldPath) == n) && !strncmp(rawPath, oldPath, n)) {
        infof(data, "Request has same path as previous transfer");
        ftpc->cwddone = TRUE;
      }
    }
  }

  free(rawPath);
  return CURLE_OK;
}